

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

int secp256k1_fe_equal(secp256k1_fe *a,secp256k1_fe *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  uint uVar173;
  int iVar174;
  uint uVar175;
  uint uVar176;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  uint uVar177;
  int iVar178;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  int extraout_EAX_07;
  int extraout_EAX_08;
  int extraout_EAX_09;
  int extraout_EAX_10;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  secp256k1_gej *psVar179;
  secp256k1_gej *psVar180;
  ulong uVar181;
  void *pvVar182;
  secp256k1_gej *in_RCX;
  secp256k1_gej *psVar183;
  secp256k1_gej *psVar184;
  uint extraout_EDX;
  ulong uVar185;
  secp256k1_gej *extraout_RDX;
  secp256k1_gej *extraout_RDX_00;
  ulong extraout_RDX_01;
  secp256k1_ge *a_00;
  secp256k1_gej *psVar186;
  long lVar187;
  secp256k1_gej *psVar188;
  ulong uVar189;
  ulong uVar190;
  uint64_t unaff_RBP;
  uint64_t uVar191;
  ulong uVar192;
  secp256k1_gej *psVar193;
  undefined8 *puVar194;
  secp256k1_gej *psVar195;
  ulong uVar196;
  secp256k1_gej *psVar197;
  ulong uVar198;
  ulong uVar199;
  secp256k1_fe *psVar200;
  undefined8 *puVar201;
  uint64_t *puVar202;
  secp256k1_gej *in_R8;
  ulong uVar203;
  uint64_t *in_R9;
  uint64_t unaff_R12;
  uint64_t uVar204;
  long lVar205;
  uint64_t unaff_R13;
  ulong uVar206;
  secp256k1_fe *unaff_R15;
  uint64_t uVar207;
  bool bVar208;
  byte bVar209;
  undefined1 auVar210 [16];
  secp256k1_fe na;
  undefined1 auStack_8b8 [56];
  uint64_t uStack_880;
  uint64_t uStack_878;
  uint64_t uStack_870;
  uint64_t uStack_868;
  int iStack_860;
  undefined1 auStack_858 [56];
  uint64_t uStack_820;
  uint64_t uStack_818;
  uint64_t uStack_810;
  uint64_t uStack_808;
  int iStack_800;
  int iStack_7fc;
  ulong uStack_7f8;
  secp256k1_gej *psStack_7f0;
  undefined1 auStack_7e8 [152];
  uint64_t uStack_750;
  uint64_t uStack_748;
  uint64_t uStack_740;
  ulong uStack_738;
  undefined8 uStack_730;
  secp256k1_fe sStack_728;
  undefined1 auStack_6f8 [56];
  ulong uStack_6c0;
  ulong uStack_6b8;
  ulong uStack_6b0;
  uint64_t uStack_6a8;
  undefined8 uStack_6a0;
  secp256k1_gej *psStack_690;
  secp256k1_gej *psStack_688;
  secp256k1_gej *psStack_680;
  secp256k1_gej *psStack_678;
  secp256k1_gej *psStack_670;
  secp256k1_gej *psStack_668;
  secp256k1_gej *psStack_658;
  secp256k1_gej *psStack_650;
  int iStack_644;
  secp256k1_gej *psStack_640;
  undefined1 auStack_638 [48];
  secp256k1_gej *psStack_608;
  secp256k1_gej *psStack_600;
  secp256k1_gej *psStack_5f8;
  secp256k1_gej *psStack_5f0;
  secp256k1_gej *psStack_5e8;
  char cStack_5d1;
  secp256k1_gej *psStack_5d0;
  secp256k1_gej *psStack_5c8;
  secp256k1_gej *psStack_5c0;
  uint64_t *puStack_5b8;
  secp256k1_gej *psStack_5b0;
  long lStack_5a8;
  secp256k1_gej *psStack_5a0;
  undefined1 auStack_598 [56];
  uint64_t uStack_560;
  uint64_t uStack_558;
  uint64_t uStack_550;
  uint64_t uStack_548;
  undefined8 uStack_540;
  undefined1 auStack_530 [24];
  undefined1 auStack_518 [16];
  undefined8 uStack_508;
  undefined1 auStack_500 [16];
  undefined1 auStack_4f0 [16];
  undefined1 auStack_4e0 [32];
  secp256k1_scalar asStack_4c0 [16];
  secp256k1_gej asStack_2b0 [3];
  secp256k1_fe *psStack_a8;
  uint64_t uStack_a0;
  uint64_t uStack_98;
  secp256k1_fe *psStack_90;
  secp256k1_fe *psStack_88;
  code *pcStack_80;
  uint64_t local_70;
  uint64_t local_68;
  secp256k1_fe local_60;
  
  bVar209 = 0;
  pcStack_80 = (code *)0x14f6df;
  psVar188 = (secp256k1_gej *)b;
  secp256k1_fe_verify(a);
  pcStack_80 = (code *)0x14f6e7;
  psVar197 = (secp256k1_gej *)b;
  secp256k1_fe_verify(b);
  if (a->magnitude < 2) {
    if (0x1f < b->magnitude) goto LAB_0014f88e;
    pcStack_80 = (code *)0x14f704;
    psVar197 = (secp256k1_gej *)a;
    secp256k1_fe_verify(a);
    if (1 < a->magnitude) goto LAB_0014f893;
    local_68 = 0x3ffffbfffff0bc - a->n[0];
    unaff_R15 = &local_60;
    unaff_R12 = 0x3ffffffffffffc - a->n[1];
    unaff_RBP = 0x3ffffffffffffc - a->n[2];
    local_70 = 0x3ffffffffffffc - a->n[3];
    unaff_R13 = 0x3fffffffffffc - a->n[4];
    local_60.magnitude = 2;
    local_60.normalized = 0;
    pcStack_80 = (code *)0x14f778;
    local_60.n[0] = local_68;
    local_60.n[1] = unaff_R12;
    local_60.n[2] = unaff_RBP;
    local_60.n[3] = local_70;
    local_60.n[4] = unaff_R13;
    secp256k1_fe_verify(unaff_R15);
    pcStack_80 = (code *)0x14f780;
    secp256k1_fe_verify(unaff_R15);
    pcStack_80 = (code *)0x14f788;
    psVar197 = (secp256k1_gej *)b;
    secp256k1_fe_verify(b);
    if (b->magnitude < 0x1f) {
      uVar207 = local_68 + b->n[0];
      uVar204 = unaff_R12 + b->n[1];
      uVar191 = unaff_RBP + b->n[2];
      local_70 = local_70 + b->n[3];
      uVar206 = unaff_R13 + b->n[4];
      local_60.normalized = 0;
      local_60.magnitude = b->magnitude + 2;
      pcStack_80 = (code *)0x14f7e5;
      local_60.n[0] = uVar207;
      local_60.n[1] = uVar204;
      local_60.n[2] = uVar191;
      local_60.n[3] = local_70;
      local_60.n[4] = uVar206;
      secp256k1_fe_verify(&local_60);
      pcStack_80 = (code *)0x14f7ed;
      secp256k1_fe_verify(&local_60);
      uVar192 = (uVar206 >> 0x30) * 0x1000003d1 + uVar207;
      uVar185 = (uVar192 >> 0x34) + uVar204;
      uVar198 = (uVar185 >> 0x34) + uVar191;
      uVar199 = (uVar198 >> 0x34) + local_70;
      uVar206 = (uVar199 >> 0x34) + (uVar206 & 0xffffffffffff);
      return (int)(((uVar192 ^ 0x1000003d0) & uVar185 & uVar198 & uVar199 &
                   (uVar206 ^ 0xf000000000000)) == 0xfffffffffffff ||
                  ((uVar185 | uVar192 | uVar198 | uVar199) & 0xfffffffffffff) == 0 && uVar206 == 0);
    }
  }
  else {
    pcStack_80 = (code *)0x14f88e;
    secp256k1_fe_equal_cold_4();
LAB_0014f88e:
    pcStack_80 = (code *)0x14f893;
    secp256k1_fe_equal_cold_3();
LAB_0014f893:
    pcStack_80 = (code *)0x14f898;
    secp256k1_fe_equal_cold_2();
  }
  pcStack_80 = secp256k1_ecmult_strauss_wnaf;
  secp256k1_fe_equal_cold_1();
  auStack_530._0_8_ = 1;
  auStack_530._8_16_ = (undefined1  [16])0x0;
  auStack_518 = (undefined1  [16])0x0;
  uStack_508._0_4_ = 1;
  uStack_508._4_4_ = 1;
  psStack_5e8 = (secp256k1_gej *)0x14f8f4;
  psVar183 = in_RCX;
  psVar184 = in_R8;
  puStack_5b8 = in_R9;
  psStack_5b0 = psVar188;
  psStack_a8 = b;
  uStack_a0 = unaff_R12;
  uStack_98 = unaff_R13;
  psStack_90 = a;
  psStack_88 = unaff_R15;
  pcStack_80 = (code *)unaff_RBP;
  secp256k1_fe_verify((secp256k1_fe *)auStack_530);
  cStack_5d1 = '\x01';
  if (extraout_RDX == (secp256k1_gej *)0x0) {
    psStack_5d0 = (secp256k1_gej *)0x0;
  }
  else {
    psVar193 = (secp256k1_gej *)0x0;
    psStack_5d0 = (secp256k1_gej *)0x0;
    uVar185 = extraout_RAX;
    psVar188 = extraout_RDX;
    do {
      psVar179 = asStack_2b0;
      auVar210._0_4_ = -(uint)((int)(in_R8->x).n[2] == 0 && (int)(in_R8->x).n[0] == 0);
      auVar210._4_4_ =
           -(uint)(*(int *)((long)(in_R8->x).n + 0x14) == 0 && *(int *)((long)(in_R8->x).n + 4) == 0
                  );
      auVar210._8_4_ = -(uint)((int)(in_R8->x).n[3] == 0 && (int)(in_R8->x).n[1] == 0);
      auVar210._12_4_ =
           -(uint)(*(int *)((long)(in_R8->x).n + 0x1c) == 0 &&
                  *(int *)((long)(in_R8->x).n + 0xc) == 0);
      uVar173 = movmskps((int)uVar185,auVar210);
      uVar185 = (ulong)(uVar173 ^ 0xf);
      if ((uVar173 ^ 0xf) != 0) {
        psStack_5e8 = (secp256k1_gej *)0x14f942;
        secp256k1_gej_verify(in_RCX);
        uVar185 = extraout_RAX_00;
        if (in_RCX->infinity == 0) {
          psStack_5e8 = (secp256k1_gej *)0x14f965;
          secp256k1_scalar_split_lambda
                    (asStack_4c0,(secp256k1_scalar *)auStack_598,(secp256k1_scalar *)in_R8);
          psVar186 = (secp256k1_gej *)((long)psVar193 * 0x410);
          psStack_5e8 = (secp256k1_gej *)0x14f98f;
          psStack_5c0 = psVar193;
          iVar174 = secp256k1_ecmult_wnaf
                              ((int *)((long)(psVar186->x).n + (psVar197->x).n[2]),0x81,asStack_4c0,
                               5);
          uVar191 = (psVar197->x).n[2];
          psVar195 = (secp256k1_gej *)((long)psVar186[3].y.n + uVar191 + 0xc);
          *(int *)((long)psVar186[6].z.n + uVar191 + 0x18) = iVar174;
          psVar193 = (secp256k1_gej *)0x81;
          psStack_5e8 = (secp256k1_gej *)0x14f9b8;
          uVar175 = secp256k1_ecmult_wnaf((int *)psVar195,0x81,(secp256k1_scalar *)auStack_598,5);
          uVar191 = (psVar197->x).n[2];
          *(uint *)((long)psVar186[6].z.n + uVar191 + 0x1c) = uVar175;
          uVar173 = *(uint *)((long)psVar186[6].z.n + uVar191 + 0x18);
          psVar183 = (secp256k1_gej *)(ulong)uVar173;
          if (0x81 < (int)uVar173) goto LAB_0014ffb4;
          if (0x81 < (int)uVar175) goto LAB_0014ffb9;
          if ((int)uVar173 <= (int)psStack_5d0) {
            psVar183 = (secp256k1_gej *)((ulong)psStack_5d0 & 0xffffffff);
          }
          if ((int)psVar183 < (int)uVar175) {
            psVar183 = (secp256k1_gej *)(ulong)uVar175;
          }
          psStack_5e8 = (secp256k1_gej *)0x14fa06;
          psStack_5d0 = psVar183;
          memcpy(psVar179,in_RCX,0x98);
          psVar193 = psStack_5c0;
          if (psStack_5c0 != (secp256k1_gej *)0x0) {
            psStack_5e8 = (secp256k1_gej *)0x14fa26;
            secp256k1_gej_rescale(psVar179,(secp256k1_fe *)auStack_530);
          }
          psVar183 = asStack_2b0;
          psStack_5e8 = (secp256k1_gej *)0x14fa52;
          secp256k1_ecmult_odd_multiples_table
                    ((int)psVar193 * 0x340 + (int)(psVar197->x).n[1],
                     (secp256k1_ge *)((long)psVar193 * 0x180 + (psVar197->x).n[0]),
                     (secp256k1_fe *)auStack_530,&psVar183->x,psVar184);
          uVar185 = extraout_RAX_01;
          if (psVar193 != (secp256k1_gej *)0x0) {
            psVar200 = (secp256k1_fe *)((long)psVar193 * 0x180 + (psVar197->x).n[0]);
            psStack_5e8 = (secp256k1_gej *)0x14fa76;
            secp256k1_fe_mul(psVar200,psVar200,&in_RCX->z);
            uVar185 = extraout_RAX_02;
          }
          psVar193 = (secp256k1_gej *)((long)(psVar193->x).n + 1);
        }
      }
      in_RCX = in_RCX + 1;
      in_R8 = (secp256k1_gej *)((in_R8->x).n + 4);
      psVar188 = (secp256k1_gej *)&psVar188[-1].field_0x97;
    } while (psVar188 != (secp256k1_gej *)0x0);
    if (psVar193 != (secp256k1_gej *)0x0) {
      psStack_5e8 = (secp256k1_gej *)0x14fab1;
      cStack_5d1 = psVar193 == (secp256k1_gej *)0x0;
      secp256k1_ge_table_set_globalz
                ((long)psVar193 * 8,(secp256k1_ge *)(psVar197->x).n[1],
                 (secp256k1_fe *)(psVar197->x).n[0]);
      lVar205 = 0;
      psVar184 = (secp256k1_gej *)0x0;
      psVar188 = (secp256k1_gej *)0x0;
      psStack_5c0 = psVar193;
      do {
        lVar187 = 0;
        psStack_5c8 = psVar184;
        do {
          psStack_5e8 = (secp256k1_gej *)0x14fae4;
          secp256k1_fe_mul((secp256k1_fe *)((psVar197->x).n[0] + lVar205 + lVar187),
                           (secp256k1_fe *)((long)(psVar184->x).n + (psVar197->x).n[1]),
                           &secp256k1_const_beta);
          psVar184 = (secp256k1_gej *)((psVar184->z).n + 1);
          lVar187 = lVar187 + 0x30;
        } while (lVar187 != 0x180);
        psVar188 = (secp256k1_gej *)((long)(psVar188->x).n + 1);
        psVar184 = (secp256k1_gej *)(psStack_5c8[5].y.n + 3);
        lVar205 = lVar205 + 0x180;
      } while (psVar188 != psStack_5c0);
      goto LAB_0014fb22;
    }
  }
  psStack_5c0 = (secp256k1_gej *)0x0;
LAB_0014fb22:
  psVar195 = psStack_5b0;
  if (puStack_5b8 == (uint64_t *)0x0) {
    puStack_5b8 = (uint64_t *)0x0;
    lStack_5a8 = 0;
    uVar173 = (uint)psStack_5d0;
  }
  else {
    auStack_4e0._0_8_ = *puStack_5b8;
    auStack_4e0._8_8_ = puStack_5b8[1];
    auStack_4e0._16_16_ = (undefined1  [16])0x0;
    auStack_500 = *(undefined1 (*) [16])(puStack_5b8 + 2);
    auStack_4f0 = (undefined1  [16])0x0;
    psStack_5e8 = (secp256k1_gej *)0x14fb80;
    uVar175 = secp256k1_ecmult_wnaf((int *)asStack_2b0,0x81,(secp256k1_scalar *)auStack_4e0,0xf);
    psVar183 = (secp256k1_gej *)0xf;
    psStack_5e8 = (secp256k1_gej *)0x14fb9c;
    uVar176 = secp256k1_ecmult_wnaf((int *)asStack_4c0,0x81,(secp256k1_scalar *)auStack_500,0xf);
    uVar173 = (uint)psStack_5d0;
    if ((int)(uint)psStack_5d0 < (int)uVar175) {
      uVar173 = uVar175;
    }
    if ((int)uVar173 < (int)uVar176) {
      uVar173 = uVar176;
    }
    lStack_5a8 = (long)(int)uVar176;
    puStack_5b8 = (uint64_t *)(long)(int)uVar175;
  }
  psStack_5e8 = (secp256k1_gej *)0x14fbdb;
  secp256k1_gej_set_infinity(psVar195);
  iVar174 = extraout_EAX;
  if (0 < (int)uVar173) {
    psVar188 = (secp256k1_gej *)(ulong)uVar173;
    psStack_5d0 = (secp256k1_gej *)((long)psVar188 * 4 + -4);
    psStack_5a0 = psVar197;
    do {
      psStack_5e8 = (secp256k1_gej *)0x14fc04;
      secp256k1_gej_double_var(psVar195,psVar195,(secp256k1_fe *)0x0);
      psStack_5c8 = psVar188;
      psVar193 = psVar188;
      iVar174 = extraout_EAX_00;
      if (cStack_5d1 == '\0') {
        in_R8 = (secp256k1_gej *)0x40c;
        in_RCX = (secp256k1_gej *)0x30;
        psVar186 = (secp256k1_gej *)0x0;
        psVar188 = psStack_5d0;
        psVar179 = psStack_5c0;
        do {
          psVar183 = (secp256k1_gej *)(psVar197->x).n[2];
          if (((long)psVar193 <= (long)*(int *)(&psVar183[-1].field_0x94 + (long)in_R8)) &&
             (uVar173 = *(uint *)((long)(psVar183->x).n + (long)(psVar188->x).n), uVar173 != 0)) {
            if ((uVar173 & 1) == 0) {
              psStack_5e8 = (secp256k1_gej *)0x14ff91;
              secp256k1_ecmult_strauss_wnaf_cold_6();
LAB_0014ff91:
              psStack_5e8 = (secp256k1_gej *)0x14ff96;
              secp256k1_ecmult_strauss_wnaf_cold_3();
LAB_0014ff96:
              psStack_5e8 = (secp256k1_gej *)0x14ff9b;
              secp256k1_ecmult_strauss_wnaf_cold_10();
LAB_0014ff9b:
              psStack_5e8 = (secp256k1_gej *)0x14ffa0;
              secp256k1_ecmult_strauss_wnaf_cold_5();
LAB_0014ffa0:
              psStack_5e8 = (secp256k1_gej *)0x14ffa5;
              secp256k1_ecmult_strauss_wnaf_cold_7();
LAB_0014ffa5:
              psStack_5e8 = (secp256k1_gej *)0x14ffaa;
              secp256k1_ecmult_strauss_wnaf_cold_9();
            }
            else {
              if ((int)uVar173 < -0xf) goto LAB_0014ff91;
              if (0xf < (int)uVar173) goto LAB_0014ff9b;
              uVar191 = (psVar197->x).n[1];
              if (0 < (int)uVar173) {
                puVar194 = (undefined8 *)
                           ((long)&in_RCX->x + uVar191 + (ulong)(uVar173 - 1 >> 1) * 0x68 + -0x30);
                puVar201 = (undefined8 *)auStack_598;
                for (lVar205 = 0xd; lVar205 != 0; lVar205 = lVar205 + -1) {
                  *puVar201 = *puVar194;
                  puVar194 = puVar194 + (ulong)bVar209 * -2 + 1;
                  puVar201 = puVar201 + (ulong)bVar209 * -2 + 1;
                }
LAB_0014fd3f:
                psStack_5e8 = (secp256k1_gej *)0x14fd51;
                psVar195 = psStack_5b0;
                secp256k1_gej_add_ge_var
                          (psStack_5b0,psStack_5b0,(secp256k1_ge *)auStack_598,(secp256k1_fe *)0x0);
                psVar183 = (secp256k1_gej *)(psVar197->x).n[2];
                psVar193 = psStack_5c8;
                goto LAB_0014fd5a;
              }
              psVar193 = (secp256k1_gej *)
                         ((long)&in_RCX->x + uVar191 + (ulong)(~uVar173 >> 1) * 0x68 + -0x30);
              puVar202 = (uint64_t *)auStack_598;
              for (psVar183 = (secp256k1_gej *)0xd; psVar183 != (secp256k1_gej *)0x0;
                  psVar183 = (secp256k1_gej *)&psVar183[-1].field_0x97) {
                *puVar202 = (psVar193->x).n[0];
                psVar193 = (secp256k1_gej *)((long)psVar193 + (ulong)bVar209 * -0x10 + 8);
                puVar202 = puVar202 + (ulong)bVar209 * -2 + 1;
              }
              psVar197 = (secp256k1_gej *)(auStack_598 + 0x30);
              psStack_5e8 = (secp256k1_gej *)0x14fcc3;
              psVar195 = psVar197;
              secp256k1_fe_verify((secp256k1_fe *)psVar197);
              if ((int)uStack_540 < 2) {
                auStack_598._48_8_ = 0x3ffffbfffff0bc - auStack_598._48_8_;
                uStack_560 = 0x3ffffffffffffc - uStack_560;
                uStack_558 = 0x3ffffffffffffc - uStack_558;
                uStack_550 = 0x3ffffffffffffc - uStack_550;
                uStack_548 = 0x3fffffffffffc - uStack_548;
                uStack_540._0_4_ = 2;
                uStack_540._4_4_ = 0;
                psStack_5e8 = (secp256k1_gej *)0x14fd35;
                secp256k1_fe_verify((secp256k1_fe *)psVar197);
                psVar197 = psStack_5a0;
                goto LAB_0014fd3f;
              }
            }
            psStack_5e8 = (secp256k1_gej *)0x14ffaf;
            secp256k1_ecmult_strauss_wnaf_cold_4();
LAB_0014ffaf:
            psStack_5e8 = (secp256k1_gej *)0x14ffb4;
            secp256k1_ecmult_strauss_wnaf_cold_8();
            goto LAB_0014ffb4;
          }
LAB_0014fd5a:
          if (((long)psVar193 <= (long)*(int *)((long)(psVar183->x).n + (long)(in_R8->x).n)) &&
             (uVar173 = *(uint *)((undefined1 *)((long)psVar183[3].y.n + 0xc) + (long)psVar188),
             uVar173 != 0)) {
            if ((uVar173 & 1) == 0) goto LAB_0014ff96;
            if ((int)uVar173 < -0xf) goto LAB_0014ffa0;
            if (0xf < (int)uVar173) goto LAB_0014ffa5;
            uVar191 = (psVar197->x).n[0];
            uVar204 = (psVar197->x).n[1];
            if (0 < (int)uVar173) {
              uVar185 = (ulong)(uVar173 - 1 >> 1);
              psStack_5e8 = (secp256k1_gej *)0x14fdc4;
              secp256k1_ge_set_xy((secp256k1_ge *)auStack_598,
                                  (secp256k1_fe *)((long)(&psVar186->x)[uVar185].n + uVar191),
                                  (secp256k1_fe *)((long)&in_RCX->x + uVar185 * 0x68 + uVar204));
LAB_0014fe73:
              psVar183 = (secp256k1_gej *)0x0;
              psStack_5e8 = (secp256k1_gej *)0x14fe85;
              psVar195 = psStack_5b0;
              secp256k1_gej_add_ge_var
                        (psStack_5b0,psStack_5b0,(secp256k1_ge *)auStack_598,(secp256k1_fe *)0x0);
              psVar193 = psStack_5c8;
              psVar197 = psStack_5a0;
              goto LAB_0014fe8f;
            }
            psVar183 = (secp256k1_gej *)((ulong)(~uVar173 >> 1) * 0x30);
            psVar193 = (secp256k1_gej *)((long)(psVar183->x).n + (long)(psVar186->x).n + uVar191);
            psStack_5e8 = (secp256k1_gej *)0x14fdef;
            secp256k1_ge_set_xy((secp256k1_ge *)auStack_598,(secp256k1_fe *)psVar193,
                                (secp256k1_fe *)
                                ((long)&in_RCX->x + (ulong)(~uVar173 >> 1) * 0x68 + uVar204));
            psVar197 = (secp256k1_gej *)(auStack_598 + 0x30);
            psStack_5e8 = (secp256k1_gej *)0x14fdfc;
            psVar195 = psVar197;
            secp256k1_fe_verify((secp256k1_fe *)psVar197);
            if ((int)uStack_540 < 2) {
              auStack_598._48_8_ = 0x3ffffbfffff0bc - auStack_598._48_8_;
              uStack_560 = 0x3ffffffffffffc - uStack_560;
              uStack_558 = 0x3ffffffffffffc - uStack_558;
              uStack_550 = 0x3ffffffffffffc - uStack_550;
              uStack_548 = 0x3fffffffffffc - uStack_548;
              uStack_540._0_4_ = 2;
              uStack_540._4_4_ = 0;
              psStack_5e8 = (secp256k1_gej *)0x14fe6e;
              secp256k1_fe_verify((secp256k1_fe *)psVar197);
              goto LAB_0014fe73;
            }
            goto LAB_0014ffaf;
          }
LAB_0014fe8f:
          iVar174 = 0x410;
          psVar188 = (secp256k1_gej *)(psVar188[6].z.n + 4);
          in_R8 = (secp256k1_gej *)(in_R8[6].z.n + 4);
          in_RCX = (secp256k1_gej *)(in_RCX[5].y.n + 3);
          psVar186 = (secp256k1_gej *)(psVar186[2].y.n + 4);
          psVar179 = (secp256k1_gej *)&psVar179[-1].field_0x97;
        } while (psVar179 != (secp256k1_gej *)0x0);
      }
      psVar195 = psStack_5b0;
      psVar188 = (secp256k1_gej *)&psVar193[-1].field_0x97;
      if (((long)psVar193 <= (long)puStack_5b8) &&
         (iVar178 = *(int *)((long)asStack_2b0[0].x.n + (long)psVar188 * 4), iVar178 != 0)) {
        psStack_5e8 = (secp256k1_gej *)0x14fee3;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)auStack_598,secp256k1_pre_g,iVar178,(int)psVar183);
        psVar183 = (secp256k1_gej *)auStack_530;
        psStack_5e8 = (secp256k1_gej *)0x14fefc;
        secp256k1_gej_add_zinv_var
                  (psVar195,psVar195,(secp256k1_ge *)auStack_598,(secp256k1_fe *)psVar183);
        psVar193 = psStack_5c8;
        iVar174 = extraout_EAX_01;
      }
      if (((long)psVar193 <= lStack_5a8) &&
         (iVar178 = *(int *)((long)asStack_4c0[0].d + (long)psVar188 * 4), iVar178 != 0)) {
        psStack_5e8 = (secp256k1_gej *)0x14ff2a;
        secp256k1_ecmult_table_get_ge_storage
                  ((secp256k1_ge *)auStack_598,secp256k1_pre_g_128,iVar178,(int)psVar183);
        psVar183 = (secp256k1_gej *)auStack_530;
        psStack_5e8 = (secp256k1_gej *)0x14ff43;
        secp256k1_gej_add_zinv_var
                  (psVar195,psVar195,(secp256k1_ge *)auStack_598,(secp256k1_fe *)psVar183);
        psVar193 = psStack_5c8;
        iVar174 = extraout_EAX_02;
      }
      psStack_5d0 = (secp256k1_gej *)&psStack_5d0[-1].field_0x94;
    } while (1 < (long)psVar193);
  }
  if (psVar195->infinity == 0) {
    psStack_5e8 = (secp256k1_gej *)0x14ff7a;
    secp256k1_fe_mul(&psVar195->z,&psVar195->z,(secp256k1_fe *)auStack_530);
    iVar174 = extraout_EAX_03;
  }
  return iVar174;
LAB_0014ffb4:
  psStack_5e8 = (secp256k1_gej *)0x14ffb9;
  secp256k1_ecmult_strauss_wnaf_cold_2();
LAB_0014ffb9:
  psStack_5e8 = (secp256k1_gej *)secp256k1_ecmult_wnaf;
  secp256k1_ecmult_strauss_wnaf_cold_1();
  psStack_640 = psVar195;
  auStack_638._40_8_ = psVar186;
  psStack_608 = in_R8;
  psStack_600 = in_RCX;
  psStack_5f8 = psVar197;
  psStack_5f0 = psVar179;
  psStack_5e8 = psVar188;
  if (psVar195 == (secp256k1_gej *)0x0) {
LAB_00150112:
    psStack_650 = (secp256k1_gej *)0x150117;
    secp256k1_ecmult_wnaf_cold_5();
    psVar184 = psVar183;
LAB_00150117:
    psStack_650 = (secp256k1_gej *)0x15011c;
    secp256k1_ecmult_wnaf_cold_4();
LAB_0015011c:
    psStack_650 = (secp256k1_gej *)0x150121;
    secp256k1_ecmult_wnaf_cold_3();
  }
  else {
    psVar184 = psVar183;
    in_R8 = extraout_RDX_00;
    if (extraout_RDX_00 == (secp256k1_gej *)0x0) goto LAB_00150117;
    uVar173 = (uint)psVar183;
    psVar186 = (secp256k1_gej *)((ulong)psVar183 & 0xffffffff);
    in_R8 = extraout_RDX_00;
    if ((int)uVar173 < 2) goto LAB_0015011c;
    iVar174 = (int)psVar193;
    psVar188 = (secp256k1_gej *)((ulong)psVar193 & 0xffffffff);
    uVar185 = (ulong)psVar193 & 0xffffffff;
    psVar193 = (secp256k1_gej *)0x0;
    psStack_650 = (secp256k1_gej *)0x150008;
    memset(psVar195,0,uVar185 << 2);
    auStack_638._24_8_ = (extraout_RDX_00->x).n[3];
    auStack_638._16_8_ = (extraout_RDX_00->x).n[2];
    auStack_638._0_8_ = (extraout_RDX_00->x).n[0];
    auStack_638._8_8_ = (extraout_RDX_00->x).n[1];
    iStack_644 = 1;
    if ((long)auStack_638._24_8_ < 0) {
      psVar193 = (secp256k1_gej *)auStack_638;
      psStack_650 = (secp256k1_gej *)0x15003a;
      psVar195 = psVar193;
      secp256k1_scalar_negate((secp256k1_scalar *)psVar193,(secp256k1_scalar *)psVar193);
      iStack_644 = -1;
    }
    iVar178 = 0;
    in_R8 = extraout_RDX_00;
    psVar179 = (secp256k1_gej *)0x0;
    if (iVar174 < 1) {
LAB_001500e1:
      while( true ) {
        psVar183 = *(secp256k1_gej **)(auStack_638 + ((ulong)psVar179 >> 6) * 8);
        if (((ulong)psVar183 >> ((ulong)psVar179 & 0x3f) & 1) != 0) break;
        uVar173 = (int)psVar179 + 1;
        psVar179 = (secp256k1_gej *)(ulong)uVar173;
        if (uVar173 == 0x100) {
          return iVar178;
        }
      }
      psStack_650 = (secp256k1_gej *)0x150112;
      secp256k1_ecmult_wnaf_cold_2();
      goto LAB_00150112;
    }
    psVar197 = (secp256k1_gej *)(ulong)(uVar173 - 1);
    in_R8 = (secp256k1_gej *)0x0;
    psVar179 = (secp256k1_gej *)0xffffffff;
    in_RCX = (secp256k1_gej *)0x0;
    do {
      psVar180 = in_RCX;
      uVar175 = (uint)psVar180;
      psVar184 = *(secp256k1_gej **)(auStack_638 + ((ulong)psVar180 >> 6) * 8);
      if ((uint)(((ulong)psVar184 >> ((ulong)psVar180 & 0x3f) & 1) != 0) == (uint)in_R8) {
        uVar175 = uVar175 + 1;
        psVar180 = psVar179;
      }
      else {
        uVar176 = iVar174 - uVar175;
        if ((int)uVar173 <= (int)(iVar174 - uVar175)) {
          uVar176 = uVar173;
        }
        psVar195 = (secp256k1_gej *)auStack_638;
        psStack_650 = (secp256k1_gej *)0x15009c;
        psVar193 = psVar180;
        uVar177 = secp256k1_scalar_get_bits_var((secp256k1_scalar *)psVar195,uVar175,uVar176);
        uVar177 = uVar177 + (uint)in_R8;
        bVar208 = (uVar177 >> (uVar173 - 1 & 0x1f) & 1) != 0;
        in_R8 = (secp256k1_gej *)(ulong)bVar208;
        psVar184 = (secp256k1_gej *)(long)(int)uVar175;
        *(uint *)((long)(psStack_640->x).n + (long)psVar184 * 4) =
             (uVar177 - ((uint)bVar208 << ((byte)psVar183 & 0x1f))) * iStack_644;
        uVar175 = uVar176 + uVar175;
      }
      in_RCX = (secp256k1_gej *)(ulong)uVar175;
      psVar179 = psVar180;
    } while ((int)uVar175 < iVar174);
    psVar179 = in_RCX;
    if ((int)in_R8 == 0) {
      iVar178 = (int)psVar180 + 1;
      if (0xff < (int)uVar175) {
        return iVar178;
      }
      goto LAB_001500e1;
    }
  }
  psStack_650 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
  secp256k1_ecmult_wnaf_cold_1();
  psStack_658 = psVar186;
  psStack_650 = psVar197;
  if ((extraout_RDX_01 & 1) == 0) {
    psStack_668 = (secp256k1_gej *)0x1501eb;
    secp256k1_ecmult_table_get_ge_storage_cold_4();
    psVar183 = psVar195;
LAB_001501eb:
    psStack_668 = (secp256k1_gej *)0x1501f0;
    secp256k1_ecmult_table_get_ge_storage_cold_1();
LAB_001501f0:
    psStack_668 = (secp256k1_gej *)0x1501f5;
    secp256k1_ecmult_table_get_ge_storage_cold_3();
  }
  else {
    uVar173 = (uint)extraout_RDX_01;
    psVar183 = psVar195;
    if ((int)uVar173 < -0x3fff) goto LAB_001501eb;
    if (0x3fff < (int)uVar173) goto LAB_001501f0;
    if (0 < (int)uVar173) {
      secp256k1_ge_from_storage
                ((secp256k1_ge *)psVar195,
                 (secp256k1_ge_storage *)((long)&psVar193->x + (ulong)(uVar173 - 1 >> 1) * 0x40));
      return extraout_EAX_04;
    }
    psVar193 = (secp256k1_gej *)((long)&psVar193->x + (ulong)(~uVar173 >> 1) * 0x40);
    psStack_668 = (secp256k1_gej *)0x15017f;
    secp256k1_ge_from_storage((secp256k1_ge *)psVar195,(secp256k1_ge_storage *)psVar193);
    psVar197 = (secp256k1_gej *)&psVar195->y;
    psStack_668 = (secp256k1_gej *)0x15018b;
    psVar183 = psVar197;
    secp256k1_fe_verify((secp256k1_fe *)psVar197);
    psVar186 = psVar195;
    if ((psVar195->y).magnitude < 2) {
      uVar191 = (psVar195->y).n[1];
      uVar204 = (psVar195->y).n[2];
      uVar207 = (psVar195->y).n[3];
      (psVar195->y).n[0] = 0x3ffffbfffff0bc - (psVar195->y).n[0];
      (psVar195->y).n[1] = 0x3ffffffffffffc - uVar191;
      (psVar195->y).n[2] = 0x3ffffffffffffc - uVar204;
      (psVar195->y).n[3] = 0x3ffffffffffffc - uVar207;
      (psVar195->y).n[4] = 0x3fffffffffffc - (psVar195->y).n[4];
      (psVar195->y).magnitude = 2;
      (psVar195->y).normalized = 0;
      secp256k1_fe_verify((secp256k1_fe *)psVar197);
      return extraout_EAX_05;
    }
  }
  psStack_668 = (secp256k1_gej *)secp256k1_gej_add_zinv_var;
  secp256k1_ecmult_table_get_ge_storage_cold_2();
  psVar195 = psVar193;
  psStack_690 = psVar186;
  psStack_688 = in_R8;
  psStack_680 = in_RCX;
  psStack_678 = psVar197;
  psStack_670 = psVar179;
  psStack_668 = psVar188;
  secp256k1_ge_verify(a_00);
  secp256k1_fe_verify(&psVar184->x);
  if (psVar193->infinity == 0) {
    if (a_00->infinity != 0) {
      pvVar182 = memcpy(psVar183,psVar193,0x98);
      return (int)pvVar182;
    }
    psVar197 = (secp256k1_gej *)&psVar193->z;
    psVar188 = (secp256k1_gej *)auStack_6f8;
    psVar195 = psVar197;
    secp256k1_fe_mul((secp256k1_fe *)psVar188,(secp256k1_fe *)psVar197,&psVar184->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    if (8 < (int)auStack_6f8._40_4_) goto LAB_0015150d;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auStack_6f8._0_8_ * 2;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = auStack_6f8._24_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = auStack_6f8._8_8_ * 2;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = auStack_6f8._16_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auStack_6f8._32_8_;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = auStack_6f8._32_8_;
    uVar192 = SUB168(auVar23 * auVar99,0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar192 & 0xfffffffffffff;
    auVar210 = auVar22 * auVar98 + auVar21 * auVar97 + auVar24 * ZEXT816(0x1000003d10);
    uVar185 = auVar210._0_8_;
    auStack_7e8._144_8_ = uVar185 & 0xfffffffffffff;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uVar185 >> 0x34 | auVar210._8_8_ << 0xc;
    uVar185 = auStack_6f8._32_8_ * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = auStack_6f8._0_8_;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar185;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = auStack_6f8._8_8_ * 2;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = auStack_6f8._24_8_;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = auStack_6f8._16_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = auStack_6f8._16_8_;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar192 >> 0x34 | SUB168(auVar23 * auVar99,8) << 0xc;
    auVar210 = auVar25 * auVar100 + auVar152 + auVar26 * auVar101 + auVar27 * auVar102 +
               auVar28 * ZEXT816(0x1000003d10);
    auStack_8b8._48_8_ = auVar210._0_8_;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (ulong)auStack_8b8._48_8_ >> 0x34 | auVar210._8_8_ << 0xc;
    auStack_7e8._96_8_ = (auStack_8b8._48_8_ & 0xfffffffffffff) >> 0x30;
    auStack_8b8._48_8_ = auStack_8b8._48_8_ & 0xffffffffffff;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = auStack_6f8._0_8_;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = auStack_6f8._0_8_;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = auStack_6f8._8_8_;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar185;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auStack_6f8._16_8_ * 2;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = auStack_6f8._24_8_;
    auVar210 = auVar30 * auVar104 + auVar153 + auVar31 * auVar105;
    uVar192 = auVar210._0_8_;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = (uVar192 & 0xfffffffffffff) << 4 | auStack_7e8._96_8_;
    auVar210 = auVar29 * auVar103 + ZEXT816(0x1000003d1) * auVar106;
    uVar192 = auVar210._0_8_;
    auStack_7e8._48_8_ = uVar192 & 0xfffffffffffff;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auStack_6f8._0_8_ * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = auStack_6f8._8_8_;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auStack_6f8._16_8_;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar185;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auStack_6f8._24_8_;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = auStack_6f8._24_8_;
    auVar21 = auVar33 * auVar108 + auVar155 + auVar34 * auVar109;
    uVar192 = auVar21._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar192 & 0xfffffffffffff;
    auVar210 = auVar32 * auVar107 + auVar154 + auVar35 * ZEXT816(0x1000003d10);
    uVar198 = auVar210._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar192 >> 0x34 | auVar21._8_8_ << 0xc;
    auStack_7e8._56_8_ = uVar198 & 0xfffffffffffff;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = uVar198 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = auStack_6f8._0_8_ * 2;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = auStack_6f8._16_8_;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = auStack_6f8._8_8_;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = auStack_6f8._8_8_;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = auStack_6f8._24_8_;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar185;
    auVar157 = auVar38 * auVar112 + auVar157;
    uVar185 = auVar157._0_8_;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar185 & 0xfffffffffffff;
    auVar210 = auVar36 * auVar110 + auVar156 + auVar37 * auVar111 + auVar39 * ZEXT816(0x1000003d10);
    uVar192 = auVar210._0_8_;
    auStack_7e8._64_8_ = uVar192 & 0xfffffffffffff;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = (uVar192 >> 0x34 | auVar210._8_8_ << 0xc) + auStack_7e8._144_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar185 >> 0x34 | auVar157._8_8_ << 0xc;
    auVar158 = auVar40 * ZEXT816(0x1000003d10) + auVar158;
    uVar185 = auVar158._0_8_;
    auStack_7e8._72_8_ = uVar185 & 0xfffffffffffff;
    auStack_7e8._80_8_ = (uVar185 >> 0x34 | auVar158._8_8_ << 0xc) + auStack_8b8._48_8_;
    auStack_7e8._88_4_ = 1;
    auStack_7e8._92_4_ = 0;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7e8 + 0x30));
    auStack_7e8._144_8_ = (psVar193->x).n[0];
    uStack_750 = (psVar193->x).n[1];
    uStack_748 = (psVar193->x).n[2];
    uStack_740 = (psVar193->x).n[3];
    uStack_738 = (psVar193->x).n[4];
    uStack_730._0_4_ = (psVar193->x).magnitude;
    uStack_730._4_4_ = (psVar193->x).normalized;
    psVar200 = (secp256k1_fe *)(auStack_7e8 + 0x90);
    secp256k1_fe_verify(psVar200);
    uVar192 = (uStack_738 >> 0x30) * 0x1000003d1 + auStack_7e8._144_8_;
    uVar185 = (uVar192 >> 0x34) + uStack_750;
    uVar206 = (uVar185 >> 0x34) + uStack_748;
    uVar198 = (uVar206 >> 0x34) + uStack_740;
    uVar199 = uVar198 & 0xfffffffffffff;
    lVar205 = (uVar198 >> 0x34) + (uStack_738 & 0xffffffffffff);
    uVar206 = uVar206 & 0xfffffffffffff;
    uVar185 = uVar185 & 0xfffffffffffff;
    uVar192 = uVar192 & 0xfffffffffffff;
    uStack_730 = CONCAT44(uStack_730._4_4_,1);
    auStack_7e8._144_8_ = uVar192;
    uStack_750 = uVar185;
    uStack_748 = uVar206;
    uStack_740 = uVar199;
    uStack_738 = lVar205;
    secp256k1_fe_verify(psVar200);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_8b8 + 0x30),&a_00->x,
                     (secp256k1_fe *)(auStack_7e8 + 0x30));
    auStack_7e8._96_8_ = (psVar193->y).n[0];
    auStack_7e8._104_8_ = (psVar193->y).n[1];
    auStack_7e8._112_8_ = (psVar193->y).n[2];
    auStack_7e8._120_8_ = (psVar193->y).n[3];
    auStack_7e8._128_8_ = (psVar193->y).n[4];
    auStack_7e8._136_4_ = (psVar193->y).magnitude;
    auStack_7e8._140_4_ = (psVar193->y).normalized;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7e8 + 0x60));
    uVar198 = ((ulong)auStack_7e8._128_8_ >> 0x30) * 0x1000003d1 + auStack_7e8._96_8_;
    uVar196 = (uVar198 >> 0x34) + auStack_7e8._104_8_;
    uVar181 = (uVar196 >> 0x34) + auStack_7e8._112_8_;
    uVar189 = (uVar181 >> 0x34) + auStack_7e8._120_8_;
    uVar203 = uVar189 & 0xfffffffffffff;
    uVar191 = (uVar189 >> 0x34) + (auStack_7e8._128_8_ & 0xffffffffffff);
    uVar181 = uVar181 & 0xfffffffffffff;
    uVar196 = uVar196 & 0xfffffffffffff;
    uVar198 = uVar198 & 0xfffffffffffff;
    auStack_7e8._136_4_ = 1;
    auStack_7e8._96_8_ = uVar198;
    auStack_7e8._104_8_ = uVar196;
    auStack_7e8._112_8_ = uVar181;
    auStack_7e8._120_8_ = uVar203;
    auStack_7e8._128_8_ = uVar191;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7e8 + 0x60));
    psVar195 = (secp256k1_gej *)auStack_858;
    secp256k1_fe_mul((secp256k1_fe *)psVar195,&a_00->y,(secp256k1_fe *)(auStack_7e8 + 0x30));
    secp256k1_fe_mul((secp256k1_fe *)psVar195,(secp256k1_fe *)psVar195,(secp256k1_fe *)auStack_6f8);
    secp256k1_fe_verify(psVar200);
    uVar192 = 0x3ffffbfffff0bc - uVar192;
    uVar185 = 0x3ffffffffffffc - uVar185;
    uVar206 = 0x3ffffffffffffc - uVar206;
    uVar199 = 0x3ffffffffffffc - uVar199;
    uVar189 = 0x3fffffffffffc - lVar205;
    auStack_7e8._40_8_ = 2;
    auStack_7e8._0_8_ = uVar192;
    auStack_7e8._8_8_ = uVar185;
    auStack_7e8._16_8_ = uVar206;
    auStack_7e8._24_8_ = uVar199;
    auStack_7e8._32_8_ = uVar189;
    secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
    secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
    psVar188 = (secp256k1_gej *)(auStack_8b8 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    if (0x1e < iStack_860) goto LAB_00151512;
    uVar192 = uVar192 + auStack_8b8._48_8_;
    uVar185 = uVar185 + uStack_880;
    uVar206 = uVar206 + uStack_878;
    uVar199 = uVar199 + uStack_870;
    uVar189 = uVar189 + uStack_868;
    auStack_7e8._44_4_ = 0;
    auStack_7e8._40_4_ = iStack_860 + 2;
    auStack_7e8._0_8_ = uVar192;
    auStack_7e8._8_8_ = uVar185;
    auStack_7e8._16_8_ = uVar206;
    auStack_7e8._24_8_ = uVar199;
    auStack_7e8._32_8_ = uVar189;
    secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
    psVar188 = (secp256k1_gej *)auStack_858;
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    if (1 < (int)auStack_858._40_4_) goto LAB_00151517;
    sStack_728.magnitude = 2;
    sStack_728.normalized = 0;
    sStack_728.n[0] = 0x3ffffbfffff0bc - auStack_858._0_8_;
    sStack_728.n[1] = 0x3ffffffffffffc - auStack_858._8_8_;
    sStack_728.n[2] = 0x3ffffffffffffc - auStack_858._16_8_;
    sStack_728.n[3] = 0x3ffffffffffffc - auStack_858._24_8_;
    sStack_728.n[4] = 0x3fffffffffffc - auStack_858._32_8_;
    secp256k1_fe_verify(&sStack_728);
    secp256k1_fe_verify(&sStack_728);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_7e8 + 0x60));
    uVar198 = (0x3ffffbfffff0bc - auStack_858._0_8_) + uVar198;
    uVar196 = (0x3ffffffffffffc - auStack_858._8_8_) + uVar196;
    uVar181 = (0x3ffffffffffffc - auStack_858._16_8_) + uVar181;
    uVar203 = (0x3ffffffffffffc - auStack_858._24_8_) + uVar203;
    uVar190 = (0x3fffffffffffc - auStack_858._32_8_) + uVar191;
    sStack_728.magnitude = 3;
    sStack_728.normalized = 0;
    sStack_728.n[0] = uVar198;
    sStack_728.n[1] = uVar196;
    sStack_728.n[2] = uVar181;
    sStack_728.n[3] = uVar203;
    sStack_728.n[4] = uVar190;
    secp256k1_fe_verify(&sStack_728);
    secp256k1_fe_verify((secp256k1_fe *)auStack_7e8);
    uVar192 = (uVar189 >> 0x30) * 0x1000003d1 + uVar192;
    if (((uVar192 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar192 & 0xfffffffffffff) == 0)) {
      uVar185 = uVar185 + (uVar192 >> 0x34);
      uVar206 = (uVar185 >> 0x34) + uVar206;
      uVar199 = (uVar206 >> 0x34) + uVar199;
      uVar189 = (uVar199 >> 0x34) + (uVar189 & 0xffffffffffff);
      if ((((uVar185 | uVar192 | uVar206 | uVar199) & 0xfffffffffffff) == 0 && uVar189 == 0) ||
         ((uVar192 + 0x1000003d0 & uVar185 & uVar206 & uVar199 & (uVar189 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        secp256k1_fe_verify(&sStack_728);
        uVar198 = (uVar190 >> 0x30) * 0x1000003d1 + uVar198;
        if (((uVar198 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar198 & 0xfffffffffffff) == 0))
        {
          uVar196 = uVar196 + (uVar198 >> 0x34);
          uVar181 = (uVar196 >> 0x34) + uVar181;
          uVar203 = (uVar181 >> 0x34) + uVar203;
          uVar185 = (uVar203 >> 0x34) + (uVar190 & 0xffffffffffff);
          if ((((uVar196 | uVar198 | uVar181 | uVar203) & 0xfffffffffffff) == 0 && uVar185 == 0) ||
             ((uVar198 + 0x1000003d0 & uVar196 & uVar181 & uVar203 & (uVar185 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            secp256k1_gej_double_var(psVar183,psVar193,(secp256k1_fe *)0x0);
            return extraout_EAX_09;
          }
        }
        secp256k1_gej_set_infinity(psVar183);
        return extraout_EAX_08;
      }
    }
    psVar183->infinity = 0;
    psVar188 = (secp256k1_gej *)auStack_7e8;
    secp256k1_fe_mul(&psVar183->z,(secp256k1_fe *)psVar197,(secp256k1_fe *)psVar188);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    if (8 < (int)auStack_7e8._40_4_) goto LAB_0015151c;
    psVar188 = (secp256k1_gej *)(auStack_6f8 + 0x30);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = auStack_7e8._0_8_ * 2;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = auStack_7e8._24_8_;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_7e8._8_8_ * 2;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = auStack_7e8._16_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = auStack_7e8._32_8_;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = auStack_7e8._32_8_;
    uVar192 = SUB168(auVar43 * auVar115,0);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar192 & 0xfffffffffffff;
    auVar210 = auVar42 * auVar114 + auVar41 * auVar113 + auVar44 * ZEXT816(0x1000003d10);
    uVar185 = auVar210._0_8_;
    auStack_8b8._0_8_ = uVar185 & 0xfffffffffffff;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uVar185 >> 0x34 | auVar210._8_8_ << 0xc;
    uVar185 = auStack_7e8._32_8_ * 2;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auStack_7e8._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar185;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = auStack_7e8._8_8_ * 2;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = auStack_7e8._24_8_;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = auStack_7e8._16_8_;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = auStack_7e8._16_8_;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar192 >> 0x34 | SUB168(auVar43 * auVar115,8) << 0xc;
    auVar210 = auVar45 * auVar116 + auVar159 + auVar46 * auVar117 + auVar47 * auVar118 +
               auVar48 * ZEXT816(0x1000003d10);
    uVar192 = auVar210._0_8_;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    psVar197 = (secp256k1_gej *)(uVar192 & 0xffffffffffff);
    auVar49._8_8_ = 0;
    auVar49._0_8_ = auStack_7e8._0_8_;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = auStack_7e8._0_8_;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = auStack_7e8._8_8_;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar185;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = auStack_7e8._16_8_ * 2;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = auStack_7e8._24_8_;
    auVar210 = auVar50 * auVar120 + auVar160 + auVar51 * auVar121;
    uVar198 = auVar210._0_8_;
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar198 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = (uVar198 & 0xfffffffffffff) << 4 | (uVar192 & 0xfffffffffffff) >> 0x30;
    auVar210 = auVar49 * auVar119 + ZEXT816(0x1000003d1) * auVar122;
    uVar192 = auVar210._0_8_;
    auStack_6f8._48_8_ = uVar192 & 0xfffffffffffff;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = auStack_7e8._0_8_ * 2;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auStack_7e8._8_8_;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = auStack_7e8._16_8_;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar185;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = auStack_7e8._24_8_;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_7e8._24_8_;
    auVar21 = auVar53 * auVar124 + auVar162 + auVar54 * auVar125;
    uVar192 = auVar21._0_8_;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar192 & 0xfffffffffffff;
    auVar210 = auVar52 * auVar123 + auVar161 + auVar55 * ZEXT816(0x1000003d10);
    uVar198 = auVar210._0_8_;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar192 >> 0x34 | auVar21._8_8_ << 0xc;
    uStack_6c0 = uVar198 & 0xfffffffffffff;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar198 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = auStack_7e8._0_8_ * 2;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auStack_7e8._16_8_;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auStack_7e8._8_8_;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_7e8._8_8_;
    auVar58._8_8_ = 0;
    auVar58._0_8_ = auStack_7e8._24_8_;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar185;
    auVar164 = auVar58 * auVar128 + auVar164;
    uVar185 = auVar164._0_8_;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar185 & 0xfffffffffffff;
    auVar210 = auVar56 * auVar126 + auVar163 + auVar57 * auVar127 + auVar59 * ZEXT816(0x1000003d10);
    uVar192 = auVar210._0_8_;
    uStack_6b8 = uVar192 & 0xfffffffffffff;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = (uVar192 >> 0x34 | auVar210._8_8_ << 0xc) + auStack_8b8._0_8_;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar185 >> 0x34 | auVar164._8_8_ << 0xc;
    auVar165 = auVar60 * ZEXT816(0x1000003d10) + auVar165;
    uVar185 = auVar165._0_8_;
    uStack_6b0 = uVar185 & 0xfffffffffffff;
    uStack_6a8 = (long)(psVar197->x).n + (uVar185 >> 0x34 | auVar165._8_8_ << 0xc);
    uStack_6a0._0_4_ = 1;
    uStack_6a0._4_4_ = 0;
    auStack_858._48_8_ = psVar197;
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    if (1 < (int)uStack_6a0) goto LAB_00151521;
    psVar200 = (secp256k1_fe *)(auStack_6f8 + 0x30);
    auStack_6f8._48_8_ = 0x3ffffbfffff0bc - auStack_6f8._48_8_;
    uStack_6c0 = 0x3ffffffffffffc - uStack_6c0;
    uStack_6b8 = 0x3ffffffffffffc - uStack_6b8;
    uStack_6b0 = 0x3ffffffffffffc - uStack_6b0;
    uStack_6a8 = 0x3fffffffffffc - uStack_6a8;
    uStack_6a0._0_4_ = 2;
    uStack_6a0._4_4_ = 0;
    secp256k1_fe_verify(psVar200);
    psVar188 = (secp256k1_gej *)auStack_8b8;
    secp256k1_fe_mul((secp256k1_fe *)psVar188,psVar200,(secp256k1_fe *)auStack_7e8);
    secp256k1_fe_mul((secp256k1_fe *)(auStack_858 + 0x30),(secp256k1_fe *)(auStack_7e8 + 0x90),
                     psVar200);
    secp256k1_fe_verify(&sStack_728);
    auVar61._8_8_ = 0;
    auVar61._0_8_ = sStack_728.n[0] * 2;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = sStack_728.n[3];
    auVar62._8_8_ = 0;
    auVar62._0_8_ = sStack_728.n[1] * 2;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = sStack_728.n[2];
    auVar63._8_8_ = 0;
    auVar63._0_8_ = sStack_728.n[4];
    auVar131._8_8_ = 0;
    auVar131._0_8_ = sStack_728.n[4];
    uVar192 = SUB168(auVar63 * auVar131,0);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar192 & 0xfffffffffffff;
    auVar210 = auVar62 * auVar130 + auVar61 * auVar129 + auVar64 * ZEXT816(0x1000003d10);
    uVar198 = auVar210._0_8_;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar198 >> 0x34 | auVar210._8_8_ << 0xc;
    uVar185 = sStack_728.n[4] * 2;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = sStack_728.n[0];
    auVar132._8_8_ = 0;
    auVar132._0_8_ = uVar185;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = sStack_728.n[1] * 2;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = sStack_728.n[3];
    auVar67._8_8_ = 0;
    auVar67._0_8_ = sStack_728.n[2];
    auVar134._8_8_ = 0;
    auVar134._0_8_ = sStack_728.n[2];
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar192 >> 0x34 | SUB168(auVar63 * auVar131,8) << 0xc;
    auVar210 = auVar65 * auVar132 + auVar166 + auVar66 * auVar133 + auVar67 * auVar134 +
               auVar68 * ZEXT816(0x1000003d10);
    uVar192 = auVar210._0_8_;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    uStack_7f8 = (uVar192 & 0xfffffffffffff) >> 0x30;
    psVar197 = (secp256k1_gej *)(uVar192 & 0xffffffffffff);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = sStack_728.n[0];
    auVar135._8_8_ = 0;
    auVar135._0_8_ = sStack_728.n[0];
    auVar70._8_8_ = 0;
    auVar70._0_8_ = sStack_728.n[1];
    auVar136._8_8_ = 0;
    auVar136._0_8_ = uVar185;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = sStack_728.n[2] * 2;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = sStack_728.n[3];
    auVar210 = auVar70 * auVar136 + auVar167 + auVar71 * auVar137;
    uVar192 = auVar210._0_8_;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = (uVar192 & 0xfffffffffffff) << 4 | uStack_7f8;
    auVar210 = auVar69 * auVar135 + ZEXT816(0x1000003d1) * auVar138;
    uVar192 = auVar210._0_8_;
    (psVar183->x).n[0] = uVar192 & 0xfffffffffffff;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar192 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = sStack_728.n[0] * 2;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = sStack_728.n[1];
    auVar73._8_8_ = 0;
    auVar73._0_8_ = sStack_728.n[2];
    auVar140._8_8_ = 0;
    auVar140._0_8_ = uVar185;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = sStack_728.n[3];
    auVar141._8_8_ = 0;
    auVar141._0_8_ = sStack_728.n[3];
    auVar21 = auVar73 * auVar140 + auVar169 + auVar74 * auVar141;
    uVar192 = auVar21._0_8_;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar192 & 0xfffffffffffff;
    auVar210 = auVar72 * auVar139 + auVar168 + auVar75 * ZEXT816(0x1000003d10);
    uVar199 = auVar210._0_8_;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar192 >> 0x34 | auVar21._8_8_ << 0xc;
    (psVar183->x).n[1] = uVar199 & 0xfffffffffffff;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar199 >> 0x34 | auVar210._8_8_ << 0xc;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = sStack_728.n[0] * 2;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = sStack_728.n[2];
    auVar77._8_8_ = 0;
    auVar77._0_8_ = sStack_728.n[1];
    auVar143._8_8_ = 0;
    auVar143._0_8_ = sStack_728.n[1];
    auVar78._8_8_ = 0;
    auVar78._0_8_ = sStack_728.n[3];
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uVar185;
    auVar171 = auVar78 * auVar144 + auVar171;
    uVar185 = auVar171._0_8_;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar185 & 0xfffffffffffff;
    auVar210 = auVar76 * auVar142 + auVar170 + auVar77 * auVar143 + auVar79 * ZEXT816(0x1000003d10);
    uVar192 = auVar210._0_8_;
    (psVar183->x).n[2] = uVar192 & 0xfffffffffffff;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = (uVar192 >> 0x34 | auVar210._8_8_ << 0xc) + (uVar198 & 0xfffffffffffff);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar185 >> 0x34 | auVar171._8_8_ << 0xc;
    auVar172 = auVar80 * ZEXT816(0x1000003d10) + auVar172;
    uVar185 = auVar172._0_8_;
    (psVar183->x).n[3] = uVar185 & 0xfffffffffffff;
    (psVar183->x).n[4] = (long)(psVar197->x).n + (uVar185 >> 0x34 | auVar172._8_8_ << 0xc);
    (psVar183->x).magnitude = 1;
    (psVar183->x).normalized = 0;
    psStack_7f0 = psVar197;
    secp256k1_fe_verify(&psVar183->x);
    secp256k1_fe_verify(&psVar183->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    iVar174 = auStack_8b8._40_4_ + (psVar183->x).magnitude;
    if (0x20 < iVar174) goto LAB_00151526;
    uVar191 = (psVar183->x).n[1];
    uVar204 = (psVar183->x).n[2];
    uVar207 = (psVar183->x).n[3];
    (psVar183->x).n[0] = (psVar183->x).n[0] + auStack_8b8._0_8_;
    (psVar183->x).n[1] = uVar191 + auStack_8b8._8_8_;
    (psVar183->x).n[2] = uVar204 + auStack_8b8._16_8_;
    (psVar183->x).n[3] = uVar207 + auStack_8b8._24_8_;
    puVar202 = (psVar183->x).n + 4;
    *puVar202 = *puVar202 + auStack_8b8._32_8_;
    (psVar183->x).magnitude = iVar174;
    (psVar183->x).normalized = 0;
    secp256k1_fe_verify(&psVar183->x);
    secp256k1_fe_verify(&psVar183->x);
    psVar188 = (secp256k1_gej *)(auStack_858 + 0x30);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    iVar174 = iStack_800 + (psVar183->x).magnitude;
    if (0x20 < iVar174) goto LAB_0015152b;
    uVar191 = (psVar183->x).n[1];
    uVar204 = (psVar183->x).n[2];
    uVar207 = (psVar183->x).n[3];
    psVar188 = (secp256k1_gej *)(auStack_858 + 0x30);
    (psVar183->x).n[0] = (long)((secp256k1_fe *)auStack_858._48_8_)->n + (psVar183->x).n[0];
    (psVar183->x).n[1] = uVar191 + uStack_820;
    (psVar183->x).n[2] = uVar204 + uStack_818;
    (psVar183->x).n[3] = uVar207 + uStack_810;
    puVar202 = (psVar183->x).n + 4;
    *puVar202 = *puVar202 + uStack_808;
    (psVar183->x).magnitude = iVar174;
    (psVar183->x).normalized = 0;
    secp256k1_fe_verify(&psVar183->x);
    secp256k1_fe_verify(&psVar183->x);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    iVar174 = iStack_800 + (psVar183->x).magnitude;
    if (0x20 < iVar174) goto LAB_00151530;
    uVar191 = (psVar183->x).n[1];
    uVar204 = (psVar183->x).n[2];
    uVar207 = (psVar183->x).n[3];
    (psVar183->x).n[0] = (long)((secp256k1_fe *)auStack_858._48_8_)->n + (psVar183->x).n[0];
    (psVar183->x).n[1] = uVar191 + uStack_820;
    (psVar183->x).n[2] = uVar204 + uStack_818;
    (psVar183->x).n[3] = uVar207 + uStack_810;
    puVar202 = (psVar183->x).n + 4;
    *puVar202 = *puVar202 + uStack_808;
    (psVar183->x).magnitude = iVar174;
    (psVar183->x).normalized = 0;
    secp256k1_fe_verify(&psVar183->x);
    secp256k1_fe_verify((secp256k1_fe *)(auStack_858 + 0x30));
    psVar188 = psVar183;
    secp256k1_fe_verify(&psVar183->x);
    iVar174 = (psVar183->x).magnitude + iStack_800;
    if (0x20 < iVar174) goto LAB_00151535;
    auStack_858._48_8_ = (long)((secp256k1_fe *)auStack_858._48_8_)->n + (psVar183->x).n[0];
    uStack_820 = (psVar183->x).n[1] + uStack_820;
    uStack_818 = (psVar183->x).n[2] + uStack_818;
    uStack_810 = (psVar183->x).n[3] + uStack_810;
    uStack_808 = uStack_808 + (psVar183->x).n[4];
    iStack_7fc = 0;
    iStack_800 = iVar174;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_858 + 0x30));
    psVar200 = &psVar183->y;
    secp256k1_fe_mul(psVar200,(secp256k1_fe *)(auStack_858 + 0x30),&sStack_728);
    psVar188 = (secp256k1_gej *)auStack_8b8;
    psVar197 = psVar188;
    secp256k1_fe_mul((secp256k1_fe *)psVar188,(secp256k1_fe *)psVar188,
                     (secp256k1_fe *)(auStack_7e8 + 0x60));
    secp256k1_fe_verify(psVar200);
    secp256k1_fe_verify((secp256k1_fe *)psVar188);
    iVar174 = auStack_8b8._40_4_ + (psVar183->y).magnitude;
    if (iVar174 < 0x21) {
      uVar191 = (psVar183->y).n[1];
      uVar204 = (psVar183->y).n[2];
      uVar207 = (psVar183->y).n[3];
      (psVar183->y).n[0] = (psVar183->y).n[0] + auStack_8b8._0_8_;
      (psVar183->y).n[1] = uVar191 + auStack_8b8._8_8_;
      (psVar183->y).n[2] = uVar204 + auStack_8b8._16_8_;
      (psVar183->y).n[3] = uVar207 + auStack_8b8._24_8_;
      puVar202 = (psVar183->y).n + 4;
      *puVar202 = *puVar202 + auStack_8b8._32_8_;
      (psVar183->y).magnitude = iVar174;
      (psVar183->y).normalized = 0;
      secp256k1_fe_verify(psVar200);
      secp256k1_gej_verify(psVar183);
      return extraout_EAX_07;
    }
  }
  else {
    psVar183->infinity = a_00->infinity;
    psVar188 = psVar184;
    secp256k1_fe_verify(&psVar184->x);
    if ((psVar184->x).magnitude < 9) {
      uVar185 = (psVar184->x).n[0];
      uVar192 = (psVar184->x).n[1];
      uVar198 = (psVar184->x).n[2];
      uVar199 = (psVar184->x).n[3];
      uVar206 = (psVar184->x).n[4];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar185 * 2;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar199;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar192 * 2;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = uVar198;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar206;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = uVar206;
      uVar181 = SUB168(auVar3 * auVar83,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar181 & 0xfffffffffffff;
      auVar210 = auVar2 * auVar82 + auVar1 * auVar81 + auVar4 * ZEXT816(0x1000003d10);
      uVar189 = auVar210._0_8_;
      auStack_7e8._48_8_ = uVar189 & 0xfffffffffffff;
      auVar145._8_8_ = 0;
      auVar145._0_8_ = uVar189 >> 0x34 | auVar210._8_8_ << 0xc;
      uVar206 = uVar206 * 2;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar185;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = uVar206;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar192 * 2;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = uVar199;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar198;
      auVar86._8_8_ = 0;
      auVar86._0_8_ = uVar198;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar181 >> 0x34 | SUB168(auVar3 * auVar83,8) << 0xc;
      auVar210 = auVar5 * auVar84 + auVar145 + auVar6 * auVar85 + auVar7 * auVar86 +
                 auVar8 * ZEXT816(0x1000003d10);
      uVar181 = auVar210._0_8_;
      auVar146._8_8_ = 0;
      auVar146._0_8_ = uVar181 >> 0x34 | auVar210._8_8_ << 0xc;
      auStack_8b8._48_8_ = (uVar181 & 0xfffffffffffff) >> 0x30;
      auStack_7e8._144_8_ = uVar181 & 0xffffffffffff;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar185;
      auVar87._8_8_ = 0;
      auVar87._0_8_ = uVar185;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = uVar192;
      auVar88._8_8_ = 0;
      auVar88._0_8_ = uVar206;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar198 * 2;
      auVar89._8_8_ = 0;
      auVar89._0_8_ = uVar199;
      auVar210 = auVar10 * auVar88 + auVar146 + auVar11 * auVar89;
      uVar181 = auVar210._0_8_;
      auVar148._8_8_ = 0;
      auVar148._0_8_ = uVar181 >> 0x34 | auVar210._8_8_ << 0xc;
      auVar90._8_8_ = 0;
      auVar90._0_8_ = (uVar181 & 0xfffffffffffff) << 4 | auStack_8b8._48_8_;
      auVar210 = auVar9 * auVar87 + ZEXT816(0x1000003d1) * auVar90;
      uVar181 = auVar210._0_8_;
      auStack_6f8._0_8_ = uVar181 & 0xfffffffffffff;
      auVar147._8_8_ = 0;
      auVar147._0_8_ = uVar181 >> 0x34 | auVar210._8_8_ << 0xc;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar185 * 2;
      auVar91._8_8_ = 0;
      auVar91._0_8_ = uVar192;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uVar198;
      auVar92._8_8_ = 0;
      auVar92._0_8_ = uVar206;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar199;
      auVar93._8_8_ = 0;
      auVar93._0_8_ = uVar199;
      auVar21 = auVar13 * auVar92 + auVar148 + auVar14 * auVar93;
      uVar181 = auVar21._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = uVar181 & 0xfffffffffffff;
      auVar210 = auVar12 * auVar91 + auVar147 + auVar15 * ZEXT816(0x1000003d10);
      uVar189 = auVar210._0_8_;
      auVar150._8_8_ = 0;
      auVar150._0_8_ = uVar181 >> 0x34 | auVar21._8_8_ << 0xc;
      auStack_6f8._8_8_ = uVar189 & 0xfffffffffffff;
      auVar149._8_8_ = 0;
      auVar149._0_8_ = uVar189 >> 0x34 | auVar210._8_8_ << 0xc;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar185 * 2;
      auVar94._8_8_ = 0;
      auVar94._0_8_ = uVar198;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar192;
      auVar95._8_8_ = 0;
      auVar95._0_8_ = uVar192;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar199;
      auVar96._8_8_ = 0;
      auVar96._0_8_ = uVar206;
      auVar150 = auVar18 * auVar96 + auVar150;
      uVar185 = auVar150._0_8_;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar185 & 0xfffffffffffff;
      auVar210 = auVar16 * auVar94 + auVar149 + auVar17 * auVar95 + auVar19 * ZEXT816(0x1000003d10);
      uVar192 = auVar210._0_8_;
      auStack_6f8._16_8_ = uVar192 & 0xfffffffffffff;
      auVar151._8_8_ = 0;
      auVar151._0_8_ = (uVar192 >> 0x34 | auVar210._8_8_ << 0xc) + auStack_7e8._48_8_;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar185 >> 0x34 | auVar150._8_8_ << 0xc;
      auVar151 = auVar20 * ZEXT816(0x1000003d10) + auVar151;
      uVar185 = auVar151._0_8_;
      auStack_6f8._24_8_ = uVar185 & 0xfffffffffffff;
      auStack_6f8._32_8_ = (uVar185 >> 0x34 | auVar151._8_8_ << 0xc) + auStack_7e8._144_8_;
      auStack_6f8._40_4_ = 1;
      auStack_6f8._44_4_ = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_6f8);
      secp256k1_fe_mul((secp256k1_fe *)(auStack_7e8 + 0x30),(secp256k1_fe *)auStack_6f8,&psVar184->x
                      );
      secp256k1_fe_mul(&psVar183->x,&a_00->x,(secp256k1_fe *)auStack_6f8);
      secp256k1_fe_mul(&psVar183->y,&a_00->y,(secp256k1_fe *)(auStack_7e8 + 0x30));
      (psVar183->z).n[0] = 1;
      (psVar183->z).n[1] = 0;
      (psVar183->z).n[2] = 0;
      (psVar183->z).n[3] = 0;
      (psVar183->z).n[4] = 0;
      (psVar183->z).magnitude = 1;
      (psVar183->z).normalized = 1;
      secp256k1_fe_verify(&psVar183->z);
      return extraout_EAX_06;
    }
    secp256k1_gej_add_zinv_var_cold_1();
LAB_0015150d:
    secp256k1_gej_add_zinv_var_cold_11();
LAB_00151512:
    secp256k1_gej_add_zinv_var_cold_10();
LAB_00151517:
    psVar197 = psVar195;
    secp256k1_gej_add_zinv_var_cold_9();
LAB_0015151c:
    secp256k1_gej_add_zinv_var_cold_8();
LAB_00151521:
    secp256k1_gej_add_zinv_var_cold_7();
LAB_00151526:
    secp256k1_gej_add_zinv_var_cold_6();
LAB_0015152b:
    secp256k1_gej_add_zinv_var_cold_5();
LAB_00151530:
    secp256k1_gej_add_zinv_var_cold_4();
LAB_00151535:
    secp256k1_gej_add_zinv_var_cold_3();
  }
  secp256k1_gej_add_zinv_var_cold_2();
  if (extraout_EDX < 0x20) {
    uVar173 = extraout_EDX + (uint)psVar197;
    if (uVar173 < 0x101) {
      uVar173 = uVar173 - 1 >> 6;
      uVar185 = (ulong)psVar197 >> 6 & 0x3ffffff;
      if (uVar173 == (uint)uVar185) {
        uVar173 = (uint)((psVar188->x).n[uVar173] >> ((byte)psVar197 & 0x3f));
LAB_00151583:
        return uVar173 & ~(uint)(-1L << ((byte)extraout_EDX & 0x3f));
      }
      if ((uint)psVar197 < 0xc0) {
        bVar209 = (byte)psVar197 & 0x3f;
        uVar173 = (uint)((psVar188->x).n[uVar185] >> bVar209) |
                  (uint)((psVar188->x).n[uVar185 + 1] << 0x40 - bVar209);
        goto LAB_00151583;
      }
      goto LAB_0015159f;
    }
  }
  else {
    secp256k1_scalar_get_bits_var_cold_3();
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_0015159f:
  secp256k1_scalar_get_bits_var_cold_1();
  *(undefined4 *)(psVar188->z).n = 1;
  (psVar188->x).magnitude = 0;
  (psVar188->x).normalized = 1;
  (psVar188->x).n[0] = 0;
  (psVar188->x).n[1] = 0;
  (psVar188->x).n[2] = 0;
  (psVar188->x).n[3] = 0;
  (psVar188->x).n[4] = 0;
  secp256k1_fe_verify(&psVar188->x);
  (psVar188->y).magnitude = 0;
  (psVar188->y).normalized = 1;
  (psVar188->y).n[0] = 0;
  (psVar188->y).n[1] = 0;
  (psVar188->y).n[2] = 0;
  (psVar188->y).n[3] = 0;
  (psVar188->y).n[4] = 0;
  secp256k1_fe_verify(&psVar188->y);
  secp256k1_ge_verify((secp256k1_ge *)psVar188);
  return extraout_EAX_10;
}

Assistant:

SECP256K1_INLINE static int secp256k1_fe_equal(const secp256k1_fe *a, const secp256k1_fe *b) {
    secp256k1_fe na;
#ifdef VERIFY
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(b);
    VERIFY_CHECK(a->magnitude <= 1);
    VERIFY_CHECK(b->magnitude <= 31);
#endif
    secp256k1_fe_negate(&na, a, 1);
    secp256k1_fe_add(&na, b);
    return secp256k1_fe_normalizes_to_zero(&na);
}